

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

char_t * pugi::impl::anon_unknown_0::strconv_cdata(char_t *s,char_t endch)

{
  byte bVar1;
  byte *pbVar2;
  byte *__src;
  byte *pbVar3;
  long lVar4;
  
  lVar4 = 0;
  __src = (byte *)0x0;
  do {
    bVar1 = *s;
    pbVar3 = (byte *)s;
    if (((anonymous_namespace)::chartype_table[bVar1] & 0x10) == 0) {
      pbVar2 = (byte *)s + 2;
      do {
        pbVar3 = pbVar2;
        bVar1 = pbVar3[-1];
        if (((anonymous_namespace)::chartype_table[bVar1] & 0x10) != 0) {
          pbVar3 = pbVar3 + -1;
          goto LAB_001141be;
        }
        bVar1 = *pbVar3;
        if (((anonymous_namespace)::chartype_table[bVar1] & 0x10) != 0) goto LAB_001141be;
        bVar1 = pbVar3[1];
        if (((anonymous_namespace)::chartype_table[bVar1] & 0x10) != 0) {
          pbVar3 = pbVar3 + 1;
          goto LAB_001141be;
        }
        bVar1 = pbVar3[2];
        pbVar2 = pbVar3 + 4;
      } while (((anonymous_namespace)::chartype_table[bVar1] & 0x10) == 0);
      pbVar3 = pbVar3 + 2;
    }
LAB_001141be:
    if (bVar1 == 0xd) {
      s = (char_t *)(pbVar3 + 1);
      *pbVar3 = 10;
      if (pbVar3[1] == 10) {
        if (__src != (byte *)0x0) {
          memmove(__src + -lVar4,__src,(long)s - (long)__src);
        }
        s = (char_t *)(pbVar3 + 2);
        lVar4 = lVar4 + 1;
        __src = (byte *)s;
      }
    }
    else {
      if (bVar1 == 0x5d) {
        if ((pbVar3[1] == 0x5d) && ((pbVar3[2] == 0x3e || (endch == '>' && pbVar3[2] == 0)))) {
          pbVar2 = pbVar3;
          if (__src != (byte *)0x0) {
            memmove(__src + -lVar4,__src,(long)pbVar3 - (long)__src);
            pbVar2 = pbVar3 + -lVar4;
          }
          *pbVar2 = 0;
          return (char_t *)(pbVar3 + 1);
        }
      }
      else if (bVar1 == 0) {
        return (char_t *)0x0;
      }
      s = (char_t *)(pbVar3 + 1);
    }
  } while( true );
}

Assistant:

PUGI_IMPL_FN char_t* strconv_cdata(char_t* s, char_t endch)
	{
		gap g;

		while (true)
		{
			PUGI_IMPL_SCANWHILE_UNROLL(!PUGI_IMPL_IS_CHARTYPE(ss, ct_parse_cdata));

			if (*s == '\r') // Either a single 0x0d or 0x0d 0x0a pair
			{
				*s++ = '\n'; // replace first one with 0x0a

				if (*s == '\n') g.push(s, 1);
			}
			else if (s[0] == ']' && s[1] == ']' && PUGI_IMPL_ENDSWITH(s[2], '>')) // CDATA ends here
			{
				*g.flush(s) = 0;

				return s + 1;
			}
			else if (*s == 0)
			{
				return NULL;
			}
			else ++s;
		}
	}